

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsvg.c
# Opt level: O0

FT_Error ft_svg_preset_slot(FT_Module module,FT_GlyphSlot slot,FT_Bool cache)

{
  FT_Memory pFVar1;
  SVG_RendererHooks hooks;
  SVG_Renderer svg_renderer;
  FT_Bool cache_local;
  FT_GlyphSlot slot_local;
  FT_Module module_local;
  
  pFVar1 = module[6].memory;
  if (*(char *)((long)&module[5].library + 1) == '\0') {
    module_local._4_4_ = 0x9e;
  }
  else {
    if (*(char *)&module[5].library == '\0') {
      (*(code *)module[5].memory)(module + 7);
      *(undefined1 *)&module[5].library = 1;
    }
    module_local._4_4_ = (*(code *)pFVar1)(slot,cache,module + 7,cache);
  }
  return module_local._4_4_;
}

Assistant:

static FT_Error
  ft_svg_preset_slot( FT_Module     module,
                      FT_GlyphSlot  slot,
                      FT_Bool       cache )
  {
    SVG_Renderer       svg_renderer = (SVG_Renderer)module;
    SVG_RendererHooks  hooks        = svg_renderer->hooks;


    if ( svg_renderer->hooks_set == FALSE )
    {
      FT_TRACE1(( "Hooks are NOT set.  Can't render OT-SVG glyphs\n" ));
      return FT_THROW( Missing_SVG_Hooks );
    }

    if ( svg_renderer->loaded == FALSE )
    {
      FT_TRACE3(( "ft_svg_preset_slot: first presetting call,"
                  " calling init hook\n" ));
      hooks.init_svg( &svg_renderer->state );

      svg_renderer->loaded = TRUE;
    }

    return hooks.preset_slot( slot, cache, &svg_renderer->state );
  }